

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O3

void quality_menu(char *unused,wchar_t also_unused)

{
  region_conflict area;
  menu_iter menu_f;
  menu_conflict menu;
  region_conflict local_108;
  menu_iter local_f8;
  menu_conflict local_c8;
  
  local_f8.resize = (_func_void_menu_ptr_conflict *)0x0;
  local_f8.display_row = quality_display;
  local_f8.row_handler = quality_action;
  local_f8.get_tag = (_func_char_menu_ptr_int *)0x0;
  local_f8.valid_row = quality_validity;
  local_108.col = 0;
  local_108.row = 0;
  local_108.width = 0;
  local_108.page_rows = 0;
  screen_save();
  clear_from(L'\0');
  menu_init(&local_c8,MN_SKIN_SCROLL,&local_f8);
  local_c8.title = "Quality ignore menu";
  menu_setpriv(&local_c8,0x19,quality_values);
  menu_layout(&local_c8,&local_108);
  menu_select(&local_c8,0,false);
  screen_load();
  return;
}

Assistant:

static void quality_menu(const char *unused, int also_unused)
{
	struct menu menu;
	menu_iter menu_f = { NULL, quality_validity, quality_display,
						 quality_action, NULL };
	region area = { 0, 0, 0, 0 };

	/* Save screen */
	screen_save();
	clear_from(0);

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu.title = "Quality ignore menu";
	menu_setpriv(&menu, ITYPE_MAX, quality_values);
	menu_layout(&menu, &area);

	/* Select an entry */
	menu_select(&menu, 0, false);

	/* Load screen */
	screen_load();
	return;
}